

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strpool.h
# Opt level: O3

char * strpool_collate(strpool_t *pool,int *count)

{
  int iVar1;
  strpool_internal_entry_t *psVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  void *__src;
  long lVar6;
  uint uVar7;
  char *__dest;
  
  pcVar3 = (char *)0x0;
  if (0 < (long)pool->entry_count) {
    lVar4 = 0;
    do {
      uVar7 = (int)pcVar3 + *(int *)((long)&pool->entries->length + lVar4) + 1;
      pcVar3 = (char *)(ulong)uVar7;
      lVar4 = lVar4 + 0x20;
    } while ((long)pool->entry_count * 0x20 != lVar4);
    if (uVar7 == 0) {
      pcVar3 = (char *)0x0;
    }
    else {
      pcVar3 = (char *)(**pool->memctx)(0,(long)(int)uVar7,0,0,0,0,
                                        *(undefined8 *)((long)pool->memctx + 8));
      if (pcVar3 == (char *)0x0) {
        __assert_fail("strings",
                      "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                      ,0x4b9,"char *strpool_collate(const strpool_t *, int *)");
      }
      iVar1 = pool->entry_count;
      *count = iVar1;
      if (0 < iVar1) {
        lVar4 = 8;
        lVar6 = 0;
        __dest = pcVar3;
        do {
          psVar2 = pool->entries;
          lVar5 = (long)*(int *)((long)&psVar2->data + lVar4 + 4);
          __src = (void *)(*(long *)((long)&psVar2->hash_slot + lVar4) + 8);
          *(void **)((long)&psVar2->hash_slot + lVar4) = __src;
          memcpy(__dest,__src,lVar5 + 1);
          __dest = __dest + lVar5 + 1;
          lVar6 = lVar6 + 1;
          lVar4 = lVar4 + 0x20;
        } while (lVar6 < pool->entry_count);
      }
    }
  }
  return pcVar3;
}

Assistant:

char* strpool_collate( strpool_t const* pool, int* count )
    {
    int size = 0;
    for( int i = 0; i < pool->entry_count; ++i ) size += pool->entries[ i ].length + 1;
    if( size == 0 ) return NULL;

    char* strings = (char*) STRPOOL_MALLOC( pool->memctx, (size_t) size );
    STRPOOL_ASSERT( strings );
    *count = pool->entry_count;
    char* ptr = strings;
    for( int i = 0; i < pool->entry_count; ++i )
        {
        int len = pool->entries[ i ].length + 1;
        char* src = pool->entries[ i ].data += 2 * sizeof( STRPOOL_U32 );
        STRPOOL_MEMCPY( ptr, src, (size_t) len );
        ptr += len;
        }
    return strings;
    }